

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall tinygltf::Material::operator==(Material *this,Material *other)

{
  bool bVar1;
  __type _Var2;
  
  bVar1 = PbrMetallicRoughness::operator==(&this->pbrMetallicRoughness,&other->pbrMetallicRoughness)
  ;
  if (bVar1) {
    bVar1 = NormalTextureInfo::operator==(&this->normalTexture,&other->normalTexture);
    if (bVar1) {
      bVar1 = OcclusionTextureInfo::operator==(&this->occlusionTexture,&other->occlusionTexture);
      if (bVar1) {
        bVar1 = TextureInfo::operator==(&this->emissiveTexture,&other->emissiveTexture);
        if (bVar1) {
          bVar1 = Equals(&this->emissiveFactor,&other->emissiveFactor);
          if (bVar1) {
            _Var2 = std::operator==(&this->alphaMode,&other->alphaMode);
            if (((_Var2) && (ABS(other->alphaCutoff - this->alphaCutoff) < 1e-12)) &&
               (this->doubleSided == other->doubleSided)) {
              bVar1 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t);
              if (bVar1) {
                bVar1 = Equals(&this->extras,&other->extras);
                if (bVar1) {
                  bVar1 = std::operator==(&(this->values)._M_t,&(other->values)._M_t);
                  if (bVar1) {
                    bVar1 = std::operator==(&(this->additionalValues)._M_t,
                                            &(other->additionalValues)._M_t);
                    if (bVar1) {
                      _Var2 = std::operator==(&this->name,&other->name);
                      return _Var2;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Material::operator==(const Material &other) const {
  return (this->pbrMetallicRoughness == other.pbrMetallicRoughness) &&
         (this->normalTexture == other.normalTexture) &&
         (this->occlusionTexture == other.occlusionTexture) &&
         (this->emissiveTexture == other.emissiveTexture) &&
         Equals(this->emissiveFactor, other.emissiveFactor) &&
         (this->alphaMode == other.alphaMode) &&
         TINYGLTF_DOUBLE_EQUAL(this->alphaCutoff, other.alphaCutoff) &&
         (this->doubleSided == other.doubleSided) &&
         (this->extensions == other.extensions) &&
         (this->extras == other.extras) && (this->values == other.values) &&
         (this->additionalValues == other.additionalValues) &&
         (this->name == other.name);
}